

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int tx_output_free(wally_tx_output *output,_Bool free_parent)

{
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  
  if (output != (wally_tx_output *)0x0) {
    clear_and_free(output->script,output->script_len);
    wally_tx_elements_output_commitment_free(output);
    wally_clear(output,0x70);
    in_EAX = extraout_EAX;
    if (free_parent) {
      wally_free(output);
      return extraout_EAX_00;
    }
  }
  return in_EAX;
}

Assistant:

static int tx_output_free(struct wally_tx_output *output, bool free_parent)
{
    if (output) {
        clear_and_free(output->script, output->script_len);
        wally_tx_elements_output_commitment_free(output);
        wally_clear(output, sizeof(*output));
        if (free_parent)
            wally_free(output);
    }
    return WALLY_OK;
}